

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessOutput.cxx
# Opt level: O2

bool __thiscall
cmProcessOutput::DecodeText
          (cmProcessOutput *this,vector<char,_std::allocator<char>_> *raw,
          vector<char,_std::allocator<char>_> *decoded,size_t id)

{
  string str;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  local_38[0] = local_28;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)local_38,
             (raw->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start,(raw->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish);
  std::__cxx11::string::swap((string *)&local_58);
  std::__cxx11::string::~string((string *)local_38);
  std::vector<char,std::allocator<char>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((vector<char,std::allocator<char>> *)decoded,local_58,local_58 + local_50);
  std::__cxx11::string::~string((string *)&local_58);
  return true;
}

Assistant:

bool cmProcessOutput::DecodeText(std::vector<char> raw,
                                 std::vector<char>& decoded, size_t id)
{
  std::string str;
  const bool success =
    this->DecodeText(std::string(raw.begin(), raw.end()), str, id);
  decoded.assign(str.begin(), str.end());
  return success;
}